

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionList.cpp
# Opt level: O2

void __thiscall curlpp::internal::OptionList::OptionList(OptionList *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_OptionList = (_func_int **)&PTR__OptionList_00134d40;
  p_Var1 = &(this->mOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

OptionList::OptionList()
{}